

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_EqualNumericConstant_Test::TestBody(ExprTest_EqualNumericConstant_Test *this)

{
  Expr e2;
  Expr e2_00;
  undefined1 uVar1;
  bool bVar2;
  ExprBase assertion_result;
  ExprBase actual_predicate_value;
  ExprBase in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar3;
  undefined1 success;
  AssertionResult *in_stack_fffffffffffffef0;
  type_conflict tVar5;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  int line;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar6;
  Type type;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  ExprBase in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  AssertionResult *in_stack_ffffffffffffff68;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_88;
  string local_78 [64];
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_38;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_28;
  AssertionResult local_18;
  
  line = 0x3fdae147;
  local_28.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeConst((ExprTest *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                           ,6.19937268235283e-318);
  uVar6 = 0;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             (NumericConstant)in_RDI.impl_,(type_conflict)((ulong)in_stack_fffffffffffffef0 >> 0x20)
            );
  local_38.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeConst((ExprTest *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                           ,6.19962465583221e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             (NumericConstant)in_RDI.impl_,(type_conflict)((ulong)in_stack_fffffffffffffef0 >> 0x20)
            );
  e2.super_ExprBase.impl_._7_1_ = in_stack_ffffffffffffff27;
  e2.super_ExprBase.impl_._0_7_ = in_stack_ffffffffffffff20;
  mp::Equal((Expr)in_stack_ffffffffffffff28.impl_,e2);
  pAVar4 = &local_18;
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffef0,SUB41((uint)in_stack_fffffffffffffeec >> 0x18,0));
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  type = (Type)((ulong)pAVar4 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff20),type,
               (char *)CONCAT44(uVar6,in_stack_ffffffffffffff10),line,(char *)in_RDI.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(local_78);
    testing::Message::~Message((Message *)0x1326ce);
  }
  tVar5 = (type_conflict)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x132749);
  assertion_result.impl_ =
       (Impl *)ExprTest::MakeConst((ExprTest *)
                                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                   6.20180348533037e-318);
  uVar3 = 0;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             (NumericConstant)in_RDI.impl_,tVar5);
  actual_predicate_value.impl_ =
       (Impl *)ExprTest::MakeConst((ExprTest *)CONCAT44(uVar3,in_stack_fffffffffffffee8),
                                   6.20206534012267e-318);
  success = (undefined1)((uint)uVar3 >> 0x18);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             (NumericConstant)in_RDI.impl_,tVar5);
  e2_00.super_ExprBase.impl_._7_1_ = uVar1;
  e2_00.super_ExprBase.impl_._0_7_ = in_stack_ffffffffffffff20;
  mp::Equal((Expr)in_stack_ffffffffffffff28.impl_,e2_00);
  pAVar4 = &local_88;
  testing::AssertionResult::AssertionResult(pAVar4,(bool)success);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)assertion_result.impl_,in_stack_ffffffffffffff60,
               (char *)actual_predicate_value.impl_,in_stack_ffffffffffffff50);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff20),type,
               (char *)CONCAT44(uVar6,in_stack_ffffffffffffff10),line,(char *)in_RDI.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,(Message *)assertion_result.impl_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    testing::Message::~Message((Message *)0x1328a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x132918);
  return;
}

Assistant:

TEST_F(ExprTest, EqualNumericConstant) {
  EXPECT_TRUE(Equal(MakeConst(0.42), MakeConst(0.42)));
  EXPECT_FALSE(Equal(MakeConst(0.42), MakeConst(42)));
}